

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmCodeTests.cpp
# Opt level: O0

void assembler::anon_unknown_1::asmcode_and_8bit(void)

{
  initializer_list<unsigned_char> __l;
  list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
  *this;
  reference this_00;
  reference pvVar1;
  uint64_t size_00;
  allocator<unsigned_char> local_18b;
  uchar local_18a [2];
  iterator local_188;
  size_type local_180;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  uint64_t local_160;
  uint64_t size;
  int local_148 [4];
  uint8_t local_138 [8];
  uint8_t buffer [255];
  asmcode code;
  
  assembler::asmcode::asmcode((asmcode *)(buffer + 0xf8));
  local_148[3] = 2;
  local_148[2] = 1;
  local_148[1] = 0x39;
  local_148[0] = 3;
  asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)(buffer + 0xf8),(operation *)(local_148 + 3),(operand *)(local_148 + 2),
             (operand *)(local_148 + 1),local_148);
  this = (list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
          *)assembler::asmcode::get_instructions_list_abi_cxx11_();
  this_00 = std::__cxx11::
            list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
            ::front(this);
  pvVar1 = std::
           vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>
           ::operator[](this_00,0);
  size_00 = assembler::asmcode::instruction::fill_opcode((uchar *)pvVar1);
  local_18a[0] = '$';
  local_18a[1] = 3;
  local_188 = local_18a;
  local_180 = 2;
  local_160 = size_00;
  std::allocator<unsigned_char>::allocator(&local_18b);
  __l._M_len = local_180;
  __l._M_array = local_188;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_178,__l,&local_18b);
  _check_buffer(local_138,size_00,&local_178);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_178);
  std::allocator<unsigned_char>::~allocator(&local_18b);
  assembler::asmcode::~asmcode((asmcode *)(buffer + 0xf8));
  return;
}

Assistant:

void asmcode_and_8bit()
    {
    asmcode code; uint8_t buffer[255];
    code.add(asmcode::AND, asmcode::AL, asmcode::NUMBER, 3);
    uint64_t size;
    size = code.get_instructions_list().front()[0].fill_opcode(buffer);
    _check_buffer(buffer, size, { 0x24, 0x03 });
    }